

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sortstring.c
# Opt level: O0

void create_strings(uchar *text,size_t text_len,uchar ***strings,size_t *strings_cnt)

{
  size_t *strings_cnt_local;
  uchar ***strings_local;
  size_t text_len_local;
  uchar *text_local;
  
  if ((char)opts._16_1_ < '\0') {
    create_strings_delim(text,text_len,0,strings,strings_cnt);
  }
  else {
    create_strings_delim(text,text_len,10,strings,strings_cnt);
  }
  return;
}

Assistant:

static void
create_strings(unsigned char *text, size_t text_len,
		unsigned char ***strings, size_t *strings_cnt)
{
	if (opts.text_raw)
		return create_strings_delim(text, text_len, '\0',
				strings, strings_cnt);
	else
		return create_strings_delim(text, text_len, '\n',
				strings, strings_cnt);
}